

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadDistantLight(XMLLoader *this,Ref<embree::XML> *xml)

{
  LightNodeImpl<embree::SceneGraph::DistantLight> *this_00;
  undefined8 *in_RDX;
  XMLLoader *pXVar1;
  string *psVar2;
  Vec3fa VVar3;
  DistantLight light;
  Vec3fa L;
  AffineSpace3fa space;
  allocator local_ed;
  float local_ec;
  undefined1 local_e8 [64];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  SharedState *local_98;
  size_t sStack_90;
  _Base_ptr local_88;
  _Base_ptr p_Stack_80;
  float local_78;
  float local_74;
  float local_70;
  undefined1 local_68 [80];
  
  pXVar1 = (XMLLoader *)*in_RDX;
  std::__cxx11::string::string((string *)(local_e8 + 0x40),"AffineSpace",(allocator *)local_68);
  XML::child((XML *)local_e8,(string *)pXVar1);
  load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
            ((AffineSpace3fa *)(local_68 + 0x10),pXVar1,(Ref<embree::XML> *)local_e8);
  if ((XML *)local_e8._0_8_ != (XML *)0x0) {
    (**(code **)(*(_func_int **)local_e8._0_8_ + 0x18))();
  }
  std::__cxx11::string::~string((string *)(local_e8 + 0x40));
  psVar2 = (string *)*in_RDX;
  std::__cxx11::string::string((string *)(local_e8 + 0x40),"L",&local_ed);
  XML::child((XML *)local_e8,psVar2);
  VVar3 = load<embree::Vec3fa>((XMLLoader *)local_68,(Ref<embree::XML> *)psVar2);
  if ((XML *)local_e8._0_8_ != (XML *)0x0) {
    (**(code **)(*(_func_int **)local_e8._0_8_ + 0x18))(VVar3.field_0._0_4_,VVar3.field_0._8_8_);
  }
  std::__cxx11::string::~string((string *)(local_e8 + 0x40));
  psVar2 = (string *)*in_RDX;
  std::__cxx11::string::string((string *)(local_e8 + 0x40),"halfAngle",&local_ed);
  pXVar1 = (XMLLoader *)local_e8;
  XML::child((XML *)pXVar1,psVar2);
  local_ec = load<float>(pXVar1,(Ref<embree::XML> *)local_e8);
  if ((XML *)local_e8._0_8_ != (XML *)0x0) {
    (**(code **)(*(_func_int **)local_e8._0_8_ + 0x18))();
  }
  std::__cxx11::string::~string((string *)(local_e8 + 0x40));
  local_a8._M_allocated_capacity._0_4_ = 4;
  local_98 = (SharedState *)0x0;
  sStack_90 = 0x3f800000;
  local_88 = (_Base_ptr)local_68._0_8_;
  p_Stack_80 = (_Base_ptr)local_68._8_8_;
  local_78 = local_ec;
  local_74 = local_ec * 0.017453292;
  local_70 = cosf(local_74);
  this_00 = (LightNodeImpl<embree::SceneGraph::DistantLight> *)
            SceneGraph::LightNodeImpl<embree::SceneGraph::DistantLight>::operator_new(0xb0);
  SceneGraph::DistantLight::transform
            ((DistantLight *)local_e8,(DistantLight *)(local_e8 + 0x40),
             (AffineSpace3fa *)(local_68 + 0x10));
  SceneGraph::LightNodeImpl<embree::SceneGraph::DistantLight>::LightNodeImpl
            (this_00,(DistantLight *)local_e8);
  (this->path).filename._M_dataplus._M_p = (pointer)this_00;
  (**(code **)(*(long *)&(this_00->super_LightNode).super_Node.super_RefCount + 0x10))(this_00);
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadDistantLight(const Ref<XML>& xml) 
  {
    const AffineSpace3fa space = load<AffineSpace3fa>(xml->child("AffineSpace"));
    const Vec3fa L = load<Vec3fa>(xml->child("L"));
    const Vec3fa D = Vec3fa(0,0,1);
    const float halfAngle = load<float>(xml->child("halfAngle"));
    const SceneGraph::DistantLight light = SceneGraph::DistantLight(D,L,halfAngle);
    return new SceneGraph::LightNodeImpl<SceneGraph::DistantLight>(light.transform(space));
  }